

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

size_t nifti_read_buffer(znzFile fp,void *dataptr,size_t ntot,nifti_image *nim)

{
  int iVar1;
  int iVar2;
  size_t nj_1;
  size_t jj_1;
  double *far_1;
  size_t nj;
  size_t jj;
  float *far;
  int fix_count;
  size_t ii;
  nifti_image *nim_local;
  size_t ntot_local;
  void *dataptr_local;
  znzFile fp_local;
  
  if (dataptr == (void *)0x0) {
    if (0 < g_opts.debug) {
      fprintf(_stderr,"** ERROR: nifti_read_buffer: NULL dataptr\n");
    }
    fp_local = (znzFile)0xffffffffffffffff;
  }
  else {
    fp_local = (znzFile)znzread(dataptr,1,ntot,fp);
    if (fp_local < ntot) {
      if (0 < g_opts.debug) {
        fprintf(_stderr,
                "++ WARNING: nifti_read_buffer(%s):\n   data bytes needed = %u\n   data bytes input  = %u\n   number missing    = %u (set to 0)\n"
                ,nim->iname,ntot & 0xffffffff,(ulong)fp_local & 0xffffffff,
                (ulong)(uint)((int)ntot - (int)fp_local));
      }
      fp_local = (znzFile)0xffffffffffffffff;
    }
    else {
      if (2 < g_opts.debug) {
        fprintf(_stderr,"+d nifti_read_buffer: read %u bytes\n",(ulong)fp_local & 0xffffffff);
      }
      if ((1 < nim->swapsize) &&
         (iVar1 = nim->byteorder, iVar2 = nifti_short_order(), iVar1 != iVar2)) {
        if (1 < g_opts.debug) {
          fprintf(_stderr,"+d nifti_read_buffer: swapping data bytes...\n");
        }
        nifti_swap_Nbytes((long)(int)(ntot / (ulong)(long)nim->swapsize),nim->swapsize,dataptr);
      }
      far._4_4_ = 0;
      iVar1 = nim->datatype;
      if ((iVar1 == 0x10) || (iVar1 == 0x20)) {
        for (nj = 0; nj < ntot >> 2; nj = nj + 1) {
          if (0x7f7fffff < (*(uint *)((long)dataptr + nj * 4) & 0x7fffffff)) {
            *(undefined4 *)((long)dataptr + nj * 4) = 0;
            far._4_4_ = far._4_4_ + 1;
          }
        }
      }
      else if ((iVar1 == 0x40) || (iVar1 == 0x700)) {
        for (nj_1 = 0; nj_1 < ntot >> 3; nj_1 = nj_1 + 1) {
          if (0x7fefffffffffffff < (*(ulong *)((long)dataptr + nj_1 * 8) & 0x7fffffffffffffff)) {
            *(undefined8 *)((long)dataptr + nj_1 * 8) = 0;
            far._4_4_ = far._4_4_ + 1;
          }
        }
      }
      if (1 < g_opts.debug) {
        fprintf(_stderr,"+d in image, %d bad floats were set to 0\n",(ulong)far._4_4_);
      }
    }
  }
  return (size_t)fp_local;
}

Assistant:

size_t nifti_read_buffer(znzFile fp, void* dataptr, size_t ntot,
                                nifti_image *nim)
{
  size_t ii;

  if( dataptr == NULL ){
     if( g_opts.debug > 0 )
        fprintf(stderr,"** ERROR: nifti_read_buffer: NULL dataptr\n");
     return -1;
  }

  ii = znzread( dataptr , 1 , ntot , fp ) ;             /* data input */

  /* if read was short, fail */
  if( ii < ntot ){
    if( g_opts.debug > 0 )
       fprintf(stderr,"++ WARNING: nifti_read_buffer(%s):\n"
               "   data bytes needed = %u\n"
               "   data bytes input  = %u\n"
               "   number missing    = %u (set to 0)\n",
               nim->iname , (unsigned int)ntot ,
               (unsigned int)ii , (unsigned int)(ntot-ii) ) ;
    /* memset( (char *)(dataptr)+ii , 0 , ntot-ii ) ;  now failure [rickr] */
    return -1 ;
  }

  if( g_opts.debug > 2 )
    fprintf(stderr,"+d nifti_read_buffer: read %u bytes\n", (unsigned)ii);

  /* byte swap array if needed */

  /* ntot/swapsize might not fit as int, use size_t    6 Jul 2010 [rickr] */
  if( nim->swapsize > 1 && nim->byteorder != nifti_short_order() ) {
    if( g_opts.debug > 1 )
       fprintf(stderr,"+d nifti_read_buffer: swapping data bytes...\n");
    nifti_swap_Nbytes( (int)(ntot / nim->swapsize), nim->swapsize , dataptr ) ;
  }

#ifdef isfinite
{
  /* check input float arrays for goodness, and fix bad floats */
  int fix_count = 0 ;

  switch( nim->datatype ){

    case NIFTI_TYPE_FLOAT32:
    case NIFTI_TYPE_COMPLEX64:{
        register float *far = (float *)dataptr ; register size_t jj,nj ;
        nj = ntot / sizeof(float) ;
        for( jj=0 ; jj < nj ; jj++ )   /* count fixes 30 Nov 2004 [rickr] */
           if( !IS_GOOD_FLOAT(far[jj]) ){
              far[jj] = 0 ;
              fix_count++ ;
           }
      }
      break ;

    case NIFTI_TYPE_FLOAT64:
    case NIFTI_TYPE_COMPLEX128:{
        register double *far = (double *)dataptr ; register size_t jj,nj ;
        nj = ntot / sizeof(double) ;
        for( jj=0 ; jj < nj ; jj++ )   /* count fixes 30 Nov 2004 [rickr] */
           if( !IS_GOOD_FLOAT(far[jj]) ){
              far[jj] = 0 ;
              fix_count++ ;
           }
      }
      break ;

  }

  if( g_opts.debug > 1 )
     fprintf(stderr,"+d in image, %d bad floats were set to 0\n", fix_count);
}
#endif

  return ii;
}